

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall slang::ast::Type::isFourState(Type *this)

{
  bool bVar1;
  Type *this_00;
  IntegralType *pIVar2;
  reference ppFVar3;
  FieldSymbol *field_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range3_1;
  UnpackedUnionType *us_1;
  FieldSymbol *field;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *__range3;
  UnpackedStructType *us;
  Type *ct;
  Type *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SymbolKind SVar4;
  Type *in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  local_58;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *local_50;
  UnpackedUnionType *local_48;
  FieldSymbol *local_40;
  FieldSymbol **local_38;
  __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *local_28;
  UnpackedStructType *local_20;
  bool local_1;
  
  this_00 = getCanonicalType((Type *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  bVar1 = isIntegral((Type *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (bVar1) {
    pIVar2 = Symbol::as<slang::ast::IntegralType>((Symbol *)0x5883e2);
    local_1 = (bool)(pIVar2->isFourState & 1);
  }
  else {
    bVar1 = isArray(in_stack_ffffffffffffff88);
    if (bVar1) {
      getArrayElementType(in_stack_ffffffffffffff98);
      local_1 = isFourState(this_00);
    }
    else {
      SVar4 = (this_00->super_Symbol).kind;
      if (SVar4 == UnpackedStructType) {
        local_20 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x58844b);
        local_28 = &local_20->fields;
        local_30._M_current =
             (FieldSymbol **)
             std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff88);
        local_38 = (FieldSymbol **)
                   std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                             ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                              in_stack_ffffffffffffff98);
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                   *)CONCAT44(SVar4,in_stack_ffffffffffffff90),
                                  (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppFVar3 = __gnu_cxx::
                    __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                    ::operator*(&local_30);
          local_40 = *ppFVar3;
          ValueSymbol::getType((ValueSymbol *)0x5884b1);
          bVar1 = isFourState(this_00);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
          ::operator++(&local_30);
        }
        local_1 = false;
      }
      else if (SVar4 == UnpackedUnionType) {
        local_48 = Symbol::as<slang::ast::UnpackedUnionType>((Symbol *)0x5884eb);
        local_50 = &local_48->fields;
        local_58._M_current =
             (FieldSymbol **)
             std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::begin
                       ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff88);
        std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::end
                  ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
                   in_stack_ffffffffffffff98);
        while (bVar1 = __gnu_cxx::
                       operator==<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                 ((__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                   *)CONCAT44(SVar4,in_stack_ffffffffffffff90),
                                  (__normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
                                   *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
          ::operator*(&local_58);
          ValueSymbol::getType((ValueSymbol *)0x588551);
          bVar1 = isFourState(this_00);
          if (bVar1) {
            return true;
          }
          __gnu_cxx::
          __normal_iterator<const_slang::ast::FieldSymbol_*const_*,_std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>_>
          ::operator++(&local_58);
        }
        local_1 = false;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool Type::isFourState() const {
    const Type& ct = getCanonicalType();
    if (ct.isIntegral())
        return ct.as<IntegralType>().isFourState;

    if (ct.isArray())
        return ct.getArrayElementType()->isFourState();

    switch (ct.kind) {
        case SymbolKind::UnpackedStructType: {
            auto& us = ct.as<UnpackedStructType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        case SymbolKind::UnpackedUnionType: {
            auto& us = ct.as<UnpackedUnionType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        default:
            return false;
    }
}